

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O3

ostream * __thiscall
Potassco::AspifTextOutput::printName(AspifTextOutput *this,ostream *os,Lit_t lit)

{
  pointer *ppppVar1;
  pointer pppVar2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *ppVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  **pppVar4;
  iterator __position;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_RAX;
  Data *this_00;
  uint uVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_28;
  
  local_28 = in_RAX;
  if (lit < 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"not ",4);
  }
  uVar5 = -lit;
  if (0 < lit) {
    uVar5 = lit;
  }
  pppVar2 = (this->data_->atoms).
            super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((((ulong)uVar5 <
        (ulong)((long)(this->data_->atoms).
                      super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pppVar2 >> 3)) &&
      (ppVar3 = pppVar2[uVar5],
      ppVar3 != (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                 *)0x0)) && (ppVar3->second == uVar5)) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,(ppVar3->first)._M_dataplus._M_p,(ppVar3->first)._M_string_length);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"x_",2);
    std::ostream::_M_insert<unsigned_long>((ulong)os);
    if (this->showAtoms_ == false) {
      this->showAtoms_ = true;
      this_00 = this->data_;
      pppVar4 = (this_00->atoms).
                super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      __position._M_current =
           (this_00->atoms).
           super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (pppVar4 == __position._M_current) {
        local_28 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                    *)0x0;
        if (pppVar4 ==
            (this_00->atoms).
            super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::pair<std::__cxx11::string_const,unsigned_int>*,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>*>>
          ::_M_realloc_insert<std::pair<std::__cxx11::string_const,unsigned_int>*>
                    ((vector<std::pair<std::__cxx11::string_const,unsigned_int>*,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>*>>
                      *)&this_00->atoms,__position,&local_28);
        }
        else {
          *__position._M_current =
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)0x0;
          ppppVar1 = &(this_00->atoms).
                      super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *ppppVar1 = *ppppVar1 + 1;
        }
        this_00 = this->data_;
      }
      Data::setGenName(this_00,0);
    }
  }
  if (uVar5 < this->maxAtom_) {
    uVar5 = this->maxAtom_;
  }
  this->maxAtom_ = uVar5;
  return os;
}

Assistant:

std::ostream& AspifTextOutput::printName(std::ostream& os, Lit_t lit) {
	if (lit < 0) { os << "not "; }
	Atom_t id = Potassco::atom(lit);
	if (const std::string* name = data_->getAtomName(id)) {
		os << *name;
	}
	else {
		os << "x_" << id;
		if (!showAtoms_) {
			showAtoms_ = true;
			if (data_->atoms.empty()) { data_->atoms.push_back(0); }
			data_->setGenName(0);
		}
	}
	maxAtom_ = std::max(maxAtom_, id);
	return os;
}